

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfoSink.cpp
# Opt level: O0

void __thiscall glslang::TInfoSinkBase::append(TInfoSinkBase *this,int count,char c)

{
  char c_local;
  int count_local;
  TInfoSinkBase *this_local;
  
  if ((this->outputStream & 4U) != 0) {
    checkMem(this,(long)count);
    std::__cxx11::string::append((ulong)this,(char)count);
  }
  if ((this->outputStream & 2U) != 0) {
    fprintf(_stdout,"%c",(ulong)(uint)(int)c);
  }
  return;
}

Assistant:

void TInfoSinkBase::append(int count, char c)
{
    if (outputStream & EString) {
        checkMem(count);
        sink.append(count, c);
    }

//#ifdef _WIN32
//    if (outputStream & EDebugger) {
//        char str[2];
//        str[0] = c;
//        str[1] = '\0';
//        OutputDebugString(str);
//    }
//#endif

    if (outputStream & EStdOut)
        fprintf(stdout, "%c", c);
}